

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# drvrnet.c
# Opt level: O0

size_t curlToMemCallback(void *buffer,size_t size,size_t nmemb,void *userp)

{
  void *pvVar1;
  size_t transferSize;
  curlmembuf *inmem;
  void *userp_local;
  size_t nmemb_local;
  size_t size_local;
  void *buffer_local;
  
  buffer_local = (void *)(size * nmemb);
  if (*(long *)((long)userp + 8) == 0) {
    pvVar1 = malloc((size_t)buffer_local);
    *(void **)userp = pvVar1;
  }
  else {
    pvVar1 = realloc(*userp,*(long *)((long)userp + 8) + (long)buffer_local);
    *(void **)userp = pvVar1;
  }
  if (*userp == 0) {
    ffpmsg("realloc error - not enough memory (curlToMemCallback)\n");
    buffer_local = (void *)0x0;
  }
  else {
    memcpy((void *)(*userp + *(long *)((long)userp + 8)),buffer,(size_t)buffer_local);
    *(long *)((long)userp + 8) = (long)buffer_local + *(long *)((long)userp + 8);
  }
  return (size_t)buffer_local;
}

Assistant:

size_t curlToMemCallback(void *buffer, size_t size, size_t nmemb, void *userp)
{
   curlmembuf* inmem = (curlmembuf* )userp;
   size_t transferSize = size*nmemb;
   if (!inmem->size)
   {
      /* First time through - initialize with malloc */
      inmem->memory = (char *)malloc(transferSize); 
   }
   else
      inmem->memory = realloc(inmem->memory, inmem->size+transferSize);
   if (inmem->memory == NULL)
   {
      ffpmsg("realloc error - not enough memory (curlToMemCallback)\n");
      return 0;
   }
   memcpy(&(inmem->memory[inmem->size]), buffer, transferSize);
   inmem->size += transferSize;
   
   return transferSize;
}